

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmTargetTraceDependencies::CheckCustomCommands
          (cmTargetTraceDependencies *this,
          vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *commands)

{
  pointer cc;
  
  for (cc = (commands->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
            _M_impl.super__Vector_impl_data._M_start;
      cc != (commands->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
            _M_impl.super__Vector_impl_data._M_finish; cc = cc + 1) {
    CheckCustomCommand(this,cc);
  }
  return;
}

Assistant:

void cmTargetTraceDependencies::CheckCustomCommands(
  const std::vector<cmCustomCommand>& commands)
{
  for (std::vector<cmCustomCommand>::const_iterator cli = commands.begin();
       cli != commands.end(); ++cli) {
    this->CheckCustomCommand(*cli);
  }
}